

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

int zip_entry_close(zip_t *zip)

{
  mz_uint64 *pmVar1;
  mz_uint32 *pmVar2;
  char cVar3;
  mz_uint64 mVar4;
  char *__ptr;
  tdefl_status tVar5;
  mz_uint32 mVar6;
  mz_bool mVar7;
  size_t sVar8;
  size_t sVar9;
  mz_uint64 *pLocal_header_ofs;
  mz_uint64 *pComp_size;
  int iVar10;
  mz_uint64 *pmVar11;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint8 extra_data [28];
  mz_uint8 local_dir_footer [24];
  mz_uint16 local_6c;
  mz_uint16 local_6a;
  mz_uint8 local_68 [32];
  undefined4 local_48;
  mz_uint32 local_44;
  mz_uint64 local_40;
  mz_uint64 local_38;
  
  iVar10 = 0;
  local_6a = 0;
  local_6c = 0;
  if (zip == (zip_t *)0x0) {
    iVar10 = -1;
  }
  else if ((zip->archive).m_zip_mode != MZ_ZIP_MODE_READING) {
    if ((zip->level & 0xf) != 0) {
      tVar5 = tdefl_compress_buffer(&(zip->entry).comp,"",0,TDEFL_FINISH);
      iVar10 = -0xc;
      if (1 < (uint)tVar5) goto LAB_00111db2;
      mVar4 = (zip->entry).state.m_cur_archive_file_ofs;
      (zip->entry).comp_size = (zip->entry).state.m_comp_size;
      (zip->entry).dir_offset = mVar4;
      (zip->entry).method = 8;
    }
    sVar8 = strlen((zip->entry).name);
    mz_zip_time_t_to_dos_time((zip->entry).m_time,&local_6a,&local_6c);
    local_48 = 0x8074b50;
    local_44 = (zip->entry).uncomp_crc32;
    local_40 = (zip->entry).comp_size;
    local_38 = (zip->entry).uncomp_size;
    sVar9 = (*(zip->archive).m_pWrite)
                      ((zip->archive).m_pIO_opaque,(zip->entry).dir_offset,&local_48,0x18);
    iVar10 = -0xe;
    if (sVar9 == 0x18) {
      pmVar1 = &(zip->entry).uncomp_size;
      pmVar11 = &(zip->entry).dir_offset;
      *pmVar11 = *pmVar11 + 0x18;
      pmVar11 = (mz_uint64 *)0x0;
      if (0xfffffffe < (zip->entry).uncomp_size) {
        pmVar11 = pmVar1;
      }
      pComp_size = &(zip->entry).comp_size;
      if ((zip->entry).comp_size < 0xffffffff) {
        pComp_size = (mz_uint64 *)0x0;
      }
      pLocal_header_ofs = &(zip->entry).header_offset;
      if ((zip->entry).header_offset < 0xffffffff) {
        pLocal_header_ofs = (mz_uint64 *)0x0;
      }
      mVar6 = mz_zip_writer_create_zip64_extra_data(local_68,pmVar11,pComp_size,pLocal_header_ofs);
      if (((sVar8 & 0xffff) != 0) &&
         (((cVar3 = (zip->entry).name[(sVar8 & 0xffff) - 1], cVar3 == '\\' || (cVar3 == '/')) &&
          (*pmVar1 == 0)))) {
        pmVar2 = &(zip->entry).external_attr;
        *(byte *)pmVar2 = (byte)*pmVar2 | 0x10;
      }
      mVar7 = mz_zip_writer_add_to_central_dir
                        (&zip->archive,(zip->entry).name,(mz_uint16)sVar8,local_68,(mz_uint16)mVar6,
                         "",0,(zip->entry).uncomp_size,(zip->entry).comp_size,
                         (zip->entry).uncomp_crc32,(zip->entry).method,0x808,local_6a,local_6c,
                         (zip->entry).header_offset,(zip->entry).external_attr,(char *)0x0,0);
      if (mVar7 == 0) {
        iVar10 = -0xf;
      }
      else {
        pmVar2 = &(zip->archive).m_total_files;
        *pmVar2 = *pmVar2 + 1;
        (zip->archive).m_archive_size = (zip->entry).dir_offset;
        iVar10 = 0;
      }
    }
  }
LAB_00111db2:
  if (zip != (zip_t *)0x0) {
    (zip->entry).m_time = 0;
    (zip->entry).index = -1;
    __ptr = (zip->entry).name;
    if (__ptr != (char *)0x0) {
      free(__ptr);
      (zip->entry).name = (char *)0x0;
    }
  }
  return iVar10;
}

Assistant:

int zip_entry_close(struct zip_t *zip) {
  mz_zip_archive *pzip = NULL;
  mz_uint level;
  tdefl_status done;
  mz_uint16 entrylen;
  mz_uint16 dos_time = 0, dos_date = 0;
  int err = 0;
  mz_uint8 *pExtra_data = NULL;
  mz_uint32 extra_size = 0;
  mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
  mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
  mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;

  if (!zip) {
    // zip_t handler is not initialized
    err = ZIP_ENOINIT;
    goto cleanup;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode == MZ_ZIP_MODE_READING) {
    goto cleanup;
  }

  level = zip->level & 0xF;
  if (level) {
    done = tdefl_compress_buffer(&(zip->entry.comp), "", 0, TDEFL_FINISH);
    if (done != TDEFL_STATUS_DONE && done != TDEFL_STATUS_OKAY) {
      // Cannot flush compressed buffer
      err = ZIP_ETDEFLBUF;
      goto cleanup;
    }
    zip->entry.comp_size = zip->entry.state.m_comp_size;
    zip->entry.dir_offset = zip->entry.state.m_cur_archive_file_ofs;
    zip->entry.method = MZ_DEFLATED;
  }

  entrylen = (mz_uint16)strlen(zip->entry.name);
#ifndef MINIZ_NO_TIME
  mz_zip_time_t_to_dos_time(zip->entry.m_time, &dos_time, &dos_date);
#endif

  MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
  MZ_WRITE_LE32(local_dir_footer + 4, zip->entry.uncomp_crc32);
  MZ_WRITE_LE64(local_dir_footer + 8, zip->entry.comp_size);
  MZ_WRITE_LE64(local_dir_footer + 16, zip->entry.uncomp_size);

  if (pzip->m_pWrite(pzip->m_pIO_opaque, zip->entry.dir_offset,
                     local_dir_footer,
                     local_dir_footer_size) != local_dir_footer_size) {
    // Cannot write zip entry header
    err = ZIP_EWRTHDR;
    goto cleanup;
  }
  zip->entry.dir_offset += local_dir_footer_size;

  pExtra_data = extra_data;
  extra_size = mz_zip_writer_create_zip64_extra_data(
      extra_data,
      (zip->entry.uncomp_size >= MZ_UINT32_MAX) ? &zip->entry.uncomp_size
                                                : NULL,
      (zip->entry.comp_size >= MZ_UINT32_MAX) ? &zip->entry.comp_size : NULL,
      (zip->entry.header_offset >= MZ_UINT32_MAX) ? &zip->entry.header_offset
                                                  : NULL);

  if ((entrylen) && ISSLASH(zip->entry.name[entrylen - 1]) &&
      !zip->entry.uncomp_size) {
    /* Set DOS Subdirectory attribute bit. */
    zip->entry.external_attr |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;
  }

  if (!mz_zip_writer_add_to_central_dir(
          pzip, zip->entry.name, entrylen, pExtra_data, (mz_uint16)extra_size,
          "", 0, zip->entry.uncomp_size, zip->entry.comp_size,
          zip->entry.uncomp_crc32, zip->entry.method,
          MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8 |
              MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR,
          dos_time, dos_date, zip->entry.header_offset,
          zip->entry.external_attr, NULL, 0)) {
    // Cannot write to zip central dir
    err = ZIP_EWRTDIR;
    goto cleanup;
  }

  pzip->m_total_files++;
  pzip->m_archive_size = zip->entry.dir_offset;

cleanup:
  if (zip) {
    zip->entry.m_time = 0;
    zip->entry.index = -1;
    CLEANUP(zip->entry.name);
  }
  return err;
}